

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

void __thiscall testing::internal::CodeLocation::~CodeLocation(CodeLocation *this)

{
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

CodeLocation(const std::string& a_file, int a_line)
      : file(a_file), line(a_line) {}